

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsLpUtils.cpp
# Opt level: O0

HighsStatus
readSolutionFileReturn
          (HighsStatus status,HighsSolution *solution,HighsBasis *basis,HighsSolution *read_solution
          ,HighsBasis *read_basis,ifstream *in_file)

{
  HighsStatus in_EDI;
  HighsSolution *in_R9;
  HighsSolution *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  std::ifstream::close();
  local_4 = in_EDI;
  if (in_EDI == kOk) {
    HighsSolution::operator=(in_R9,in_stack_ffffffffffffffc8);
    HighsBasis::operator=((HighsBasis *)in_R9,(HighsBasis *)in_stack_ffffffffffffffc8);
    local_4 = kOk;
  }
  return local_4;
}

Assistant:

HighsStatus readSolutionFileReturn(const HighsStatus status,
                                   HighsSolution& solution, HighsBasis& basis,
                                   const HighsSolution& read_solution,
                                   const HighsBasis& read_basis,
                                   std::ifstream& in_file) {
  in_file.close();
  if (status != HighsStatus::kOk) {
    return status;
  }
  solution = read_solution;
  basis = read_basis;
  return HighsStatus::kOk;
}